

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

int __thiscall
CVmObjByteArray::getp_unpackBytes
          (CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ushort *puVar4;
  long lVar5;
  ulong uVar6;
  CVmByteArraySource src;
  
  if (oargc == (uint *)0x0) {
    lVar5 = -1;
  }
  else {
    lVar5 = (long)(int)(*oargc - 1);
  }
  if ((getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    getp_unpackBytes::desc.min_argc_ = 2;
    getp_unpackBytes::desc.opt_argc_ = 0;
    getp_unpackBytes::desc.varargs_ = 0;
    __cxa_guard_release(&getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_unpackBytes::desc);
  if (iVar2 == 0) {
    uVar3 = CVmBif::pop_long_val();
    if ((int)uVar3 < 1) {
      uVar6 = 0;
    }
    else {
      uVar1 = *(uint *)(this->super_CVmObject).ext_;
      if (uVar1 < uVar3) {
        uVar3 = uVar1;
      }
      uVar6 = (ulong)uVar3 - 1;
    }
    puVar4 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    src.super_CVmDataSource._vptr_CVmDataSource = (_func_int **)&PTR__CVmDataSource_00317798;
    src.vmg = (vm_globals *)0x0;
    src.arr = (CVmObjByteArray *)(G_obj_table_X.pages_[self >> 0xc] + (self & 0xfff));
    src.start_idx = 0;
    src.end_idx = (long)**(uint **)((long)&G_obj_table_X.pages_[self >> 0xc][self & 0xfff].ptr_ + 8)
    ;
    if ((long)uVar6 < 0) {
      src.idx = 0;
    }
    else {
      src.idx = src.end_idx;
      if (uVar6 <= (ulong)src.end_idx) {
        src.idx = uVar6;
      }
    }
    src.arr_id = self;
    CVmPack::unpack(retval,(char *)(puVar4 + 1),(ulong)*puVar4,&src.super_CVmDataSource);
    sp_ = sp_ + -lVar5;
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_unpackBytes(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the starting index from the first argument */
    long idx = CVmBif::pop_long_val(vmg0_);
    --argc;

    /* limit the index to 1..length */
    if (idx < 1)
        idx = 1;
    else if ((ulong)idx > get_element_count())
        idx = get_element_count();

    /* get the format string, but leave it on the stack for gc protection */
    const char *fmt = G_stk->get(0)->get_as_string(vmg0_);

    /* get the format string length and buffer pointer */
    size_t fmtlen = vmb_get_len(fmt);
    fmt += VMB_LEN;

    /* set up a data source for the byte array */
    CVmByteArraySource src(vmg_ self);

    /* seek to the starting index */
    src.seek(idx - 1, OSFSK_SET);

    /* do the unpacking */
    CVmPack::unpack(vmg_ retval, fmt, fmtlen, &src);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}